

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chain.cpp
# Opt level: O1

CBlockIndex * __thiscall CBlockIndex::GetAncestor(CBlockIndex *this,int height)

{
  CBlockIndex *pCVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  long in_FS_OFFSET;
  
  uVar4 = this->nHeight;
  if (height < 0 || this->nHeight < height) {
    pCVar1 = (CBlockIndex *)0x0;
  }
  else {
    while (pCVar1 = this, height < (int)uVar4) {
      uVar3 = 0;
      uVar2 = 0;
      if (1 < (int)uVar4) {
        if ((uVar4 & 1) == 0) {
          uVar2 = uVar4 + 0x7fffffff & uVar4;
        }
        else {
          uVar2 = uVar4 + 0x7ffffffe & uVar4 - 1;
          uVar2 = uVar2 + 0x7fffffff & uVar2 | 1;
        }
      }
      uVar5 = uVar4 - 1;
      if (2 < (int)uVar4) {
        if ((uVar5 & 1) == 0) {
          uVar3 = uVar4 + 0x7ffffffe & uVar5;
        }
        else {
          uVar4 = uVar4 + 0x7ffffffd & uVar4 - 2;
          uVar3 = uVar4 + 0x7fffffff & uVar4 | 1;
        }
      }
      this = pCVar1->pskip;
      if (((this == (CBlockIndex *)0x0) ||
          ((uVar4 = uVar2, uVar2 != height &&
           (((int)uVar2 <= height || (height <= (int)uVar3 && (int)uVar3 < (int)(uVar2 - 2))))))) &&
         (uVar4 = uVar5, this = pCVar1->pprev, pCVar1->pprev == (CBlockIndex *)0x0)) {
        __assert_fail("pindexWalk->pprev",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/chain.cpp"
                      ,0x70,"const CBlockIndex *CBlockIndex::GetAncestor(int) const");
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != *(long *)(in_FS_OFFSET + 0x28)) {
    __stack_chk_fail();
  }
  return pCVar1;
}

Assistant:

const CBlockIndex* CBlockIndex::GetAncestor(int height) const
{
    if (height > nHeight || height < 0) {
        return nullptr;
    }

    const CBlockIndex* pindexWalk = this;
    int heightWalk = nHeight;
    while (heightWalk > height) {
        int heightSkip = GetSkipHeight(heightWalk);
        int heightSkipPrev = GetSkipHeight(heightWalk - 1);
        if (pindexWalk->pskip != nullptr &&
            (heightSkip == height ||
             (heightSkip > height && !(heightSkipPrev < heightSkip - 2 &&
                                       heightSkipPrev >= height)))) {
            // Only follow pskip if pprev->pskip isn't better than pskip->pprev.
            pindexWalk = pindexWalk->pskip;
            heightWalk = heightSkip;
        } else {
            assert(pindexWalk->pprev);
            pindexWalk = pindexWalk->pprev;
            heightWalk--;
        }
    }
    return pindexWalk;
}